

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddMatMult.c
# Opt level: O1

DdNode * addMMRecur(DdManager *dd,DdNode *A,DdNode *B,int topP,int *vars)

{
  int *piVar1;
  uint topP_00;
  DdNode *pDVar2;
  DdNode *pDVar3;
  DdNode *pDVar4;
  DdNode *pDVar5;
  DdNode *pDVar6;
  DdNode *B_00;
  uint uVar7;
  long lVar8;
  uint uVar9;
  double dVar10;
  
  pDVar2 = dd->zero;
  if (pDVar2 == B || pDVar2 == A) {
    return pDVar2;
  }
  if ((A->index == 0x7fffffff) && (B->index == 0x7fffffff)) {
    dVar10 = (A->type).value * (B->type).value;
    if (0 < (long)dd->size) {
      lVar8 = 0;
      do {
        if ((vars[lVar8] != 0) && (topP < dd->perm[lVar8])) {
          dVar10 = dVar10 + dVar10;
        }
        lVar8 = lVar8 + 1;
      } while (dd->size != lVar8);
    }
    pDVar2 = cuddUniqueConst(dd,dVar10);
    return pDVar2;
  }
  pDVar4 = A;
  if (B < A) {
    pDVar4 = B;
    B = A;
  }
  uVar9 = 0x7fffffff;
  uVar7 = 0x7fffffff;
  if ((ulong)pDVar4->index != 0x7fffffff) {
    uVar7 = dd->perm[pDVar4->index];
  }
  if ((ulong)B->index != 0x7fffffff) {
    uVar9 = dd->perm[B->index];
  }
  topP_00 = uVar7;
  if (uVar9 < uVar7) {
    topP_00 = uVar9;
  }
  pDVar3 = cuddCacheLookup2(dd,addMMRecur,pDVar4,B);
  if (pDVar3 != (DdNode *)0x0) {
    if (pDVar3 == pDVar2) {
      return pDVar3;
    }
    dVar10 = 1.0;
    if (0 < (long)dd->size) {
      lVar8 = 0;
      do {
        if (((vars[lVar8] != 0) && (topP < dd->perm[lVar8])) && ((uint)dd->perm[lVar8] < topP_00)) {
          dVar10 = dVar10 + dVar10;
        }
        lVar8 = lVar8 + 1;
      } while (dd->size != lVar8);
    }
    if (dVar10 <= 1.0) {
      return pDVar3;
    }
    piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar2 = cuddUniqueConst(dd,dVar10);
    if (pDVar2 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar2 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      pDVar4 = cuddAddApplyRecur(dd,Cudd_addTimes,pDVar3,pDVar2);
      if (pDVar4 != (DdNode *)0x0) {
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar2);
        Cudd_RecursiveDeref(dd,pDVar3);
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + -1;
        return pDVar4;
      }
      Cudd_RecursiveDeref(dd,pDVar2);
    }
    goto LAB_00787639;
  }
  pDVar5 = pDVar4;
  pDVar3 = pDVar4;
  if (uVar7 <= uVar9) {
    pDVar3 = (pDVar4->type).kids.T;
    pDVar5 = (pDVar4->type).kids.E;
  }
  B_00 = B;
  pDVar6 = B;
  if (uVar9 <= uVar7) {
    pDVar6 = (B->type).kids.T;
    B_00 = (B->type).kids.E;
  }
  pDVar3 = addMMRecur(dd,pDVar3,pDVar6,topP_00,vars);
  if (pDVar3 == (DdNode *)0x0) {
    return (DdNode *)0x0;
  }
  piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  pDVar5 = addMMRecur(dd,pDVar5,B_00,topP_00,vars);
  if (pDVar5 == (DdNode *)0x0) goto LAB_00787639;
  piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
  *piVar1 = *piVar1 + 1;
  if (vars[dd->invperm[topP_00]] == 0) {
    pDVar6 = pDVar3;
    if (pDVar3 != pDVar5) {
      pDVar6 = cuddUniqueInter(dd,dd->invperm[topP_00],pDVar3,pDVar5);
    }
    if (pDVar6 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      pDVar3 = pDVar6;
      goto LAB_0078751a;
    }
  }
  else {
    pDVar6 = cuddAddApplyRecur(dd,Cudd_addPlus,pDVar3,pDVar5);
    if (pDVar6 == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,pDVar3);
      pDVar3 = pDVar5;
      goto LAB_00787639;
    }
    piVar1 = (int *)(((ulong)pDVar6 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    Cudd_RecursiveDeref(dd,pDVar3);
    Cudd_RecursiveDeref(dd,pDVar5);
    pDVar3 = pDVar6;
LAB_0078751a:
    cuddCacheInsert2(dd,addMMRecur,pDVar4,B,pDVar3);
    pDVar4 = pDVar3;
    if (pDVar3 == pDVar2) {
LAB_007875da:
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + -1;
      return pDVar4;
    }
    dVar10 = 1.0;
    if (0 < (long)dd->size) {
      lVar8 = 0;
      do {
        if (((vars[lVar8] != 0) && (topP < dd->perm[lVar8])) && ((uint)dd->perm[lVar8] < topP_00)) {
          dVar10 = dVar10 + dVar10;
        }
        lVar8 = lVar8 + 1;
      } while (dd->size != lVar8);
    }
    if (dVar10 <= 1.0) goto LAB_007875da;
    pDVar5 = cuddUniqueConst(dd,dVar10);
    if (pDVar5 == (DdNode *)0x0) goto LAB_00787639;
    piVar1 = (int *)(((ulong)pDVar5 & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar4 = cuddAddApplyRecur(dd,Cudd_addTimes,pDVar3,pDVar5);
    if (pDVar4 != (DdNode *)0x0) {
      piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
      *piVar1 = *piVar1 + 1;
      Cudd_RecursiveDeref(dd,pDVar5);
      Cudd_RecursiveDeref(dd,pDVar3);
      goto LAB_007875da;
    }
  }
  Cudd_RecursiveDeref(dd,pDVar3);
  pDVar3 = pDVar5;
LAB_00787639:
  Cudd_RecursiveDeref(dd,pDVar3);
  return (DdNode *)0x0;
}

Assistant:

static DdNode *
addMMRecur(
  DdManager * dd,
  DdNode * A,
  DdNode * B,
  int  topP,
  int * vars)
{
    DdNode *zero,
           *At,         /* positive cofactor of first operand */
           *Ae,         /* negative cofactor of first operand */
           *Bt,         /* positive cofactor of second operand */
           *Be,         /* negative cofactor of second operand */
           *t,          /* positive cofactor of result */
           *e,          /* negative cofactor of result */
           *scaled,     /* scaled result */
           *add_scale,  /* ADD representing the scaling factor */
           *res;
    int i;              /* loop index */
    double scale;       /* scaling factor */
    int index;          /* index of the top variable */
    CUDD_VALUE_TYPE value;
    unsigned int topA, topB, topV;
    DD_CTFP cacheOp;

    statLine(dd);
    zero = DD_ZERO(dd);

    if (A == zero || B == zero) {
        return(zero);
    }

    if (cuddIsConstant(A) && cuddIsConstant(B)) {
        /* Compute the scaling factor. It is 2^k, where k is the
        ** number of summation variables below the current variable.
        ** Indeed, these constants represent blocks of 2^k identical
        ** constant values in both A and B.
        */
        value = cuddV(A) * cuddV(B);
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP) {
                    value *= (CUDD_VALUE_TYPE) 2;
                }
            }
        }
        res = cuddUniqueConst(dd, value);
        return(res);
    }

    /* Standardize to increase cache efficiency. Clearly, A*B != B*A
    ** in matrix multiplication. However, which matrix is which is
    ** determined by the variables appearing in the ADDs and not by
    ** which one is passed as first argument.
    */
    if (A > B) {
        DdNode *tmp = A;
        A = B;
        B = tmp;
    }

    topA = cuddI(dd,A->index); topB = cuddI(dd,B->index);
    topV = ddMin(topA,topB);

    cacheOp = (DD_CTFP) addMMRecur;
    res = cuddCacheLookup2(dd,cacheOp,A,B);
    if (res != NULL) {
        /* If the result is 0, there is no need to normalize.
        ** Otherwise we count the number of z variables between
        ** the current depth and the top of the ADDs. These are
        ** the missing variables that determine the size of the
        ** constant blocks.
        */
        if (res == zero) return(res);
        scale = 1.0;
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP && (unsigned) dd->perm[i] < topV) {
                    scale *= 2;
                }
            }
        }
        if (scale > 1.0) {
            cuddRef(res);
            add_scale = cuddUniqueConst(dd,(CUDD_VALUE_TYPE)scale);
            if (add_scale == NULL) {
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(add_scale);
            scaled = cuddAddApplyRecur(dd,Cudd_addTimes,res,add_scale);
            if (scaled == NULL) {
                Cudd_RecursiveDeref(dd, add_scale);
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(scaled);
            Cudd_RecursiveDeref(dd, add_scale);
            Cudd_RecursiveDeref(dd, res);
            res = scaled;
            cuddDeref(res);
        }
        return(res);
    }

    /* compute the cofactors */
    if (topV == topA) {
        At = cuddT(A);
        Ae = cuddE(A);
    } else {
        At = Ae = A;
    }
    if (topV == topB) {
        Bt = cuddT(B);
        Be = cuddE(B);
    } else {
        Bt = Be = B;
    }

    t = addMMRecur(dd, At, Bt, (int)topV, vars);
    if (t == NULL) return(NULL);
    cuddRef(t);
    e = addMMRecur(dd, Ae, Be, (int)topV, vars);
    if (e == NULL) {
        Cudd_RecursiveDeref(dd, t);
        return(NULL);
    }
    cuddRef(e);

    index = dd->invperm[topV];
    if (vars[index] == 0) {
        /* We have split on either the rows of A or the columns
        ** of B. We just need to connect the two subresults,
        ** which correspond to two submatrices of the result.
        */
        res = (t == e) ? t : cuddUniqueInter(dd,index,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        cuddDeref(t);
        cuddDeref(e);
    } else {
        /* we have simultaneously split on the columns of A and
        ** the rows of B. The two subresults must be added.
        */
        res = cuddAddApplyRecur(dd,Cudd_addPlus,t,e);
        if (res == NULL) {
            Cudd_RecursiveDeref(dd, t);
            Cudd_RecursiveDeref(dd, e);
            return(NULL);
        }
        cuddRef(res);
        Cudd_RecursiveDeref(dd, t);
        Cudd_RecursiveDeref(dd, e);
    }

    cuddCacheInsert2(dd,cacheOp,A,B,res);

    /* We have computed (and stored in the computed table) a minimal
    ** result; that is, a result that assumes no summation variables
    ** between the current depth of the recursion and its top
    ** variable. We now take into account the z variables by properly
    ** scaling the result.
    */
    if (res != zero) {
        scale = 1.0;
        for (i = 0; i < dd->size; i++) {
            if (vars[i]) {
                if (dd->perm[i] > topP && (unsigned) dd->perm[i] < topV) {
                    scale *= 2;
                }
            }
        }
        if (scale > 1.0) {
            add_scale = cuddUniqueConst(dd,(CUDD_VALUE_TYPE)scale);
            if (add_scale == NULL) {
                Cudd_RecursiveDeref(dd, res);
                return(NULL);
            }
            cuddRef(add_scale);
            scaled = cuddAddApplyRecur(dd,Cudd_addTimes,res,add_scale);
            if (scaled == NULL) {
                Cudd_RecursiveDeref(dd, res);
                Cudd_RecursiveDeref(dd, add_scale);
                return(NULL);
            }
            cuddRef(scaled);
            Cudd_RecursiveDeref(dd, add_scale);
            Cudd_RecursiveDeref(dd, res);
            res = scaled;
        }
    }
    cuddDeref(res);
    return(res);

}